

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

void gost_magma_encrypt_wrap(uchar *in,uchar *out,ossl_gost_cipher_ctx *c)

{
  long lVar1;
  uchar *puVar2;
  uchar d [8];
  uchar b [8];
  
  lVar1 = 8;
  while (lVar1 != 0) {
    d[lVar1 + 7] = *in;
    in = in + 1;
    lVar1 = lVar1 + -1;
  }
  gostcrypt(&c->cctx,b,d);
  puVar2 = out + 7;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    *puVar2 = d[lVar1];
    puVar2 = puVar2 + -1;
  }
  return;
}

Assistant:

void gost_magma_encrypt_wrap(unsigned char *in, unsigned char *out,
                   struct ossl_gost_cipher_ctx *c) {
    int i;
    unsigned char b[8];
    unsigned char d[8];
    for (i = 0; i < 8; i++) {
        b[7 - i] = in[i];
    }
    gostcrypt(&(c->cctx), b, d);
    for (i = 0; i < 8; i++) {
        out[7 - i] = d[i];
    }
}